

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::imageFormatProperties
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format,VkImageType imageType
          ,VkImageTiling tiling)

{
  VkBool32 VVar1;
  TestLog *log;
  pointer pbVar2;
  ChannelOrder CVar3;
  deUint32 dVar4;
  VkSampleCountFlags VVar5;
  VkDeviceSize VVar6;
  TestStatus *pTVar7;
  int iVar8;
  uint uVar9;
  TextureChannelClass TVar10;
  qpTestResult qVar11;
  VkPhysicalDeviceFeatures *pVVar12;
  VkPhysicalDeviceProperties *pVVar13;
  InstanceInterface *pIVar14;
  VkPhysicalDevice pVVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var17;
  ulong uVar18;
  long *plVar19;
  TextureFormat TVar20;
  uint uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  undefined8 uVar26;
  TestLog *pTVar27;
  uint uVar28;
  ostringstream *poVar29;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  VkFormatProperties VVar34;
  VkImageFormatProperties properties;
  string local_2a8;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [6];
  ios_base local_218 [8];
  ios_base local_210 [264];
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  ResultCollector results;
  Bitfield<32UL> local_98;
  TestStatus *local_78;
  ulong local_70;
  Bitfield<32UL> local_68;
  Enum<vk::VkImageTiling,_4UL> local_50;
  Enum<vk::VkImageType,_4UL> local_40;
  
  log = context->m_testCtx->m_log;
  pVVar12 = Context::getDeviceFeatures(context);
  pVVar13 = Context::getDeviceProperties(context);
  pIVar14 = Context::getInstanceInterface(context);
  pVVar15 = Context::getPhysicalDevice(context);
  VVar34 = ::vk::getPhysicalDeviceFormatProperties(pIVar14,pVVar15,format);
  pvVar16 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_288._0_8_ = local_288 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"VK_KHR_maintenance1","");
  pbVar2 = (pvVar16->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var17 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     ((pvVar16->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,pbVar2,local_288);
  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
  }
  uVar18 = VVar34._0_8_ >> 0x20;
  uVar24 = uVar18;
  if (tiling == VK_IMAGE_TILING_LINEAR) {
    uVar24 = VVar34._0_8_;
  }
  uVar23 = (uint)uVar24;
  uVar28 = (uint)(uVar23 != 0) * 3;
  if (_Var17._M_current != pbVar2) {
    uVar28 = (uint)((uVar24 & 0xffffffff) >> 0xe) & 3;
  }
  uVar21 = uVar28 + 0xd0;
  if (-1 < (char)(uVar24 & 0xffffffff)) {
    uVar21 = uVar28;
  }
  uVar21 = uVar21 + (uVar23 * 4 & 4);
  local_288._0_8_ = local_288 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"ERROR: ","");
  tcu::ResultCollector::ResultCollector(&results,log,(string *)local_288);
  if ((TestLog *)local_288._0_8_ != (TestLog *)(local_288 + 0x10)) {
    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
  }
  local_78 = __return_storage_ptr__;
  if ((uVar24 & 1) != 0 && _Var17._M_current != pbVar2) {
    local_288._0_8_ = local_288 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,
               "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set"
               ,"");
    tcu::ResultCollector::check(&results,(uVar24 & 0xc000) != 0,(string *)local_288);
    if ((TestLog *)local_288._0_8_ != (TestLog *)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
    }
  }
  uVar30 = uVar23 >> 4 & 0x20;
  uVar28 = uVar23 * 4 & 8;
  local_104 = ~(uVar28 + uVar30 | uVar21);
  local_108 = (uint)(imageType == VK_IMAGE_TYPE_2D) << 4 | 8;
  local_70 = (ulong)(uVar30 | uVar21 | uVar28);
  uVar28 = 0;
  do {
    if ((local_104 & uVar28) == 0) {
      if ((uVar28 & 0x40) == 0) {
        if (uVar28 != 0) {
          bVar32 = (uVar28 & 4) == 0;
          local_100 = (int)(uVar28 << 0x1d) >> 0x1f & local_108;
          if ((uVar28 & 0xc) != 0 && (char)((uVar28 & 0x40) >> 6) == '\0') {
            uVar23 = local_100 | 3;
            if (pVVar12->sparseBinding == 0) {
              uVar23 = local_100;
            }
            local_100 = uVar23 | 4;
            if (pVVar12->sparseResidencyAliased == 0) {
              local_100 = uVar23;
            }
          }
LAB_0041a52b:
          local_fc = ~local_100;
          local_100 = local_100 + 1;
          uVar24 = 0;
          do {
            uVar23 = (uint)uVar24;
            if ((local_fc & uVar23) == 0) {
              if (tiling == VK_IMAGE_TILING_LINEAR) {
                bVar31 = false;
              }
              else {
                bVar31 = ::vk::isCompressedFormat(format);
                if ((uVar28 < 8 || !bVar31) &&
                   (bVar31 = ::vk::isCompressedFormat(format),
                   (imageType & ~VK_IMAGE_TYPE_3D) != VK_IMAGE_TYPE_1D || !bVar31)) {
                  bVar31 = true;
                  if ((uVar24 & 2) == 0) goto LAB_0041a5ac;
                  bVar31 = ::vk::isCompressedFormat(format);
                  if ((!bVar31) && (bVar31 = ::vk::isDepthStencilFormat(format), !bVar31)) {
                    local_288._0_8_ = ::vk::mapVkFormat(format);
                    uVar21 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_288);
                    if ((uVar21 & uVar21 - 1) == 0) {
                      if (imageType == VK_IMAGE_TYPE_3D) {
                        VVar1 = pVVar12->sparseResidencyImage3D;
                      }
                      else {
                        if (imageType != VK_IMAGE_TYPE_2D) goto LAB_0041a5a4;
                        VVar1 = pVVar12->sparseResidencyImage2D;
                      }
                      bVar31 = VVar1 == 1;
                      goto LAB_0041a5ac;
                    }
                  }
                }
LAB_0041a5a4:
                bVar31 = false;
              }
LAB_0041a5ac:
              poVar29 = (ostringstream *)(local_288 + 8);
              local_288._0_8_ = log;
              std::__cxx11::ostringstream::ostringstream(poVar29);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar29,"Testing ",8);
              local_40.m_getName = ::vk::getImageTypeName;
              local_40.m_value = imageType;
              tcu::Format::Enum<vk::VkImageType,_4UL>::toStream(&local_40,(ostream *)poVar29);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar29,", ",2);
              local_50.m_getName = ::vk::getImageTilingName;
              local_50.m_value = tiling;
              tcu::Format::Enum<vk::VkImageTiling,_4UL>::toStream(&local_50,(ostream *)poVar29);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar29,", ",2);
              ::vk::getImageUsageFlagsStr(&local_98,uVar28);
              local_2a8.field_2._M_allocated_capacity = (size_type)local_98.m_end;
              local_2a8._M_dataplus._M_p = (pointer)local_98.m_value;
              local_2a8._M_string_length = (size_type)local_98.m_begin;
              tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)&local_2a8,(ostream *)poVar29)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar29,", ",2);
              ::vk::getImageCreateFlagsStr(&local_68,uVar23);
              local_2a8.field_2._M_allocated_capacity = (size_type)local_68.m_end;
              local_2a8._M_string_length = CONCAT44(local_68.m_begin._4_4_,(int)local_68.m_begin);
              local_2a8._M_dataplus._M_p = (pointer)local_68.m_value;
              tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)&local_2a8,(ostream *)poVar29)
              ;
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar29);
              std::ios_base::~ios_base(local_210);
              properties.maxExtent.width = 0xcdcdcdcd;
              properties.maxExtent.height = 0xcdcdcdcd;
              properties.maxExtent.depth = 0xcdcdcdcd;
              properties.maxMipLevels = 0xcdcdcdcd;
              properties.maxArrayLayers = 0xcdcdcdcd;
              properties.sampleCounts = 0xcdcdcdcd;
              properties.maxResourceSize = 0xcdcdcdcdcdcdcdcd;
              pIVar14 = Context::getInstanceInterface(context);
              pVVar15 = Context::getPhysicalDevice(context);
              iVar8 = (*pIVar14->_vptr_InstanceInterface[4])
                                (pIVar14,pVVar15,(ulong)format,(ulong)imageType,(ulong)tiling,
                                 (ulong)uVar28,uVar24,&properties);
              if (iVar8 == -0xb) {
                poVar29 = (ostringstream *)(local_288 + 8);
                local_288._0_8_ = log;
                std::__cxx11::ostringstream::ostringstream(poVar29);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar29,"Got VK_ERROR_FORMAT_NOT_SUPPORTED",0x21);
                pTVar27 = (TestLog *)(local_288 + 0x10);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar29);
                std::ios_base::~ios_base(local_210);
                if (bVar31) {
                  local_288._0_8_ = pTVar27;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_288,
                             "VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination"
                             ,"");
                  tcu::ResultCollector::fail(&results,(string *)local_288);
                  if ((TestLog *)local_288._0_8_ != pTVar27) {
                    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                  }
                }
                dVar4 = properties.maxExtent.width;
                local_288._0_8_ = pTVar27;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"maxExtent.width != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_288);
                if ((TestLog *)local_288._0_8_ != pTVar27) {
                  operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxExtent.height;
                local_288._0_8_ = pTVar27;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"maxExtent.height != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_288);
                if ((TestLog *)local_288._0_8_ != pTVar27) {
                  operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxExtent.depth;
                local_288._0_8_ = pTVar27;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"maxExtent.depth != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_288);
                if ((TestLog *)local_288._0_8_ != pTVar27) {
                  operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxMipLevels;
                local_288._0_8_ = pTVar27;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"maxMipLevels != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_288);
                if ((TestLog *)local_288._0_8_ != pTVar27) {
                  operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                }
                dVar4 = properties.maxArrayLayers;
                local_288._0_8_ = pTVar27;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"maxArrayLayers != 0","");
                tcu::ResultCollector::check(&results,dVar4 == 0,(string *)local_288);
                if ((TestLog *)local_288._0_8_ != pTVar27) {
                  operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                }
                VVar5 = properties.sampleCounts;
                local_288._0_8_ = pTVar27;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"sampleCounts != 0","");
                tcu::ResultCollector::check(&results,VVar5 == 0,(string *)local_288);
                if ((TestLog *)local_288._0_8_ != pTVar27) {
                  operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                }
                VVar6 = properties.maxResourceSize;
                local_288._0_8_ = pTVar27;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_288,"maxResourceSize != 0","");
                tcu::ResultCollector::check(&results,VVar6 == 0,(string *)local_288);
LAB_0041b396:
                uVar26 = local_278[0]._M_allocated_capacity;
                pTVar27 = (TestLog *)local_288._0_8_;
                if ((TestLog *)local_288._0_8_ == (TestLog *)(local_288 + 0x10)) goto LAB_0041b3b7;
              }
              else {
                if (iVar8 == 0) {
                  uVar30 = 0x20;
                  uVar21 = 0x20;
                  if (properties.maxExtent.width != 0) {
                    uVar21 = 0x1f;
                    if (properties.maxExtent.width != 0) {
                      for (; properties.maxExtent.width >> uVar21 == 0; uVar21 = uVar21 - 1) {
                      }
                    }
                    uVar21 = uVar21 ^ 0x1f;
                  }
                  if (properties.maxExtent.height != 0) {
                    uVar30 = 0x1f;
                    if (properties.maxExtent.height != 0) {
                      for (; properties.maxExtent.height >> uVar30 == 0; uVar30 = uVar30 - 1) {
                      }
                    }
                    uVar30 = uVar30 ^ 0x1f;
                  }
                  iVar25 = 0x1f - ((uVar21 - 1) +
                                  (uint)((properties.maxExtent.width - 1 &
                                         properties.maxExtent.width) == 0));
                  iVar8 = 0x1f - ((uVar30 - 1) +
                                 (uint)((properties.maxExtent.height - 1 &
                                        properties.maxExtent.height) == 0));
                  if (iVar8 < iVar25) {
                    iVar8 = iVar25;
                  }
                  if (properties.maxExtent.depth == 0) {
                    uVar21 = 0x20;
                  }
                  else {
                    uVar21 = 0x1f;
                    if (properties.maxExtent.depth != 0) {
                      for (; properties.maxExtent.depth >> uVar21 == 0; uVar21 = uVar21 - 1) {
                      }
                    }
                    uVar21 = uVar21 ^ 0x1f;
                  }
                  iVar25 = 0x1f - ((uVar21 - 1) +
                                  (uint)((properties.maxExtent.depth - 1 &
                                         properties.maxExtent.depth) == 0));
                  if (iVar25 < iVar8) {
                    iVar25 = iVar8;
                  }
                  poVar29 = (ostringstream *)(local_288 + 8);
                  local_288._0_8_ = log;
                  std::__cxx11::ostringstream::ostringstream(poVar29);
                  ::vk::operator<<((ostream *)poVar29,&properties);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar29,"\n",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_288,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(poVar29);
                  std::ios_base::~ios_base(local_210);
                  bVar33 = true;
                  if (imageType == VK_IMAGE_TYPE_1D) {
                    bVar33 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar33 = false, properties.maxExtent.height == 1)) {
                      bVar33 = properties.maxExtent.depth == 1;
                    }
                  }
                  local_288._0_8_ = local_288 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_288,"Invalid dimensions for 1D image","");
                  tcu::ResultCollector::check(&results,bVar33,(string *)local_288);
                  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                  }
                  bVar33 = true;
                  if (imageType == VK_IMAGE_TYPE_2D) {
                    bVar33 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar33 = false, properties.maxExtent.height != 0)) {
                      bVar33 = properties.maxExtent.depth == 1;
                    }
                  }
                  local_288._0_8_ = local_288 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_288,"Invalid dimensions for 2D image","");
                  tcu::ResultCollector::check(&results,bVar33,(string *)local_288);
                  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                  }
                  bVar33 = true;
                  if (imageType == VK_IMAGE_TYPE_3D) {
                    bVar33 = false;
                    if ((properties.maxExtent.width != 0) &&
                       (bVar33 = false, properties.maxExtent.height != 0)) {
                      bVar33 = properties.maxExtent.depth != 0;
                    }
                  }
                  local_288._0_8_ = local_288 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_288,"Invalid dimensions for 3D image","");
                  tcu::ResultCollector::check(&results,bVar33,(string *)local_288);
                  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                  }
                  dVar4 = properties.maxArrayLayers;
                  local_288._0_8_ = local_288 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_288,"Invalid maxArrayLayers for 3D image","");
                  tcu::ResultCollector::check
                            (&results,dVar4 == 1 || imageType != VK_IMAGE_TYPE_3D,
                             (string *)local_288);
                  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                  }
                  VVar5 = properties.sampleCounts;
                  if (tiling == VK_IMAGE_TILING_OPTIMAL) {
                    if (((uVar24 & 0x10) == 0 && imageType == VK_IMAGE_TYPE_2D) &&
                       (((uVar18 & 0x280) != 0 ||
                        (((uVar18 & 2) != 0 && (pVVar12->shaderStorageImageMultisample != 0)))))) {
                      bVar33 = ::vk::isCompressedFormat(format);
                      uVar21 = 1;
                      if (!bVar33) {
                        TVar20 = ::vk::mapVkFormat(format);
                        CVar3 = TVar20.order;
                        uVar21 = CVar3 - CHANNELORDER_LAST;
                        uVar30 = -(uint)((uVar28 & 8) == 0) |
                                 (pVVar13->limits).storageImageSampleCounts;
                        if (!bVar32) {
                          if ((CVar3 == DS) || (CVar3 == D)) {
                            uVar9 = 0xffffffff;
                            if (0xfffffffd < uVar21) {
                              uVar9 = (pVVar13->limits).sampledImageStencilSampleCounts;
                            }
                            uVar30 = uVar30 & uVar9 & (pVVar13->limits).
                                                      sampledImageDepthSampleCounts;
                          }
                          else {
                            uVar9 = 0xffffffff;
                            if (0xfffffffd < uVar21) {
                              uVar9 = (pVVar13->limits).sampledImageStencilSampleCounts;
                            }
                            if (uVar21 < 0xfffffffd) {
                              TVar10 = tcu::getTextureChannelClass(TVar20.type);
                              uVar30 = uVar30 & (uint)(pVVar13->limits).pointSizeRange
                                                      [(ulong)((TVar10 & ~
                                                  TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ==
                                                  TEXTURECHANNELCLASS_SIGNED_INTEGER) - 0xc];
                            }
                            else {
                              uVar30 = uVar30 & uVar9;
                            }
                          }
                        }
                        uVar30 = (-(uint)((uVar28 & 0x10) == 0) |
                                 (pVVar13->limits).framebufferColorSampleCounts) & uVar30;
                        if ((uVar28 & 0x20) != 0) {
                          if ((CVar3 == DS) || (CVar3 == D)) {
                            uVar30 = uVar30 & (pVVar13->limits).framebufferDepthSampleCounts;
                          }
                          if (0xfffffffd < uVar21) {
                            uVar30 = uVar30 & (pVVar13->limits).framebufferStencilSampleCounts;
                          }
                        }
                        uVar21 = 1;
                        if (uVar30 != 0xffffffff) {
                          uVar21 = uVar30;
                        }
                      }
                      VVar5 = properties.sampleCounts;
                      local_288._0_8_ = local_288 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_288,"Required sample counts not supported","");
                      tcu::ResultCollector::check
                                (&results,(uVar21 & ~VVar5) == 0,(string *)local_288);
                      goto LAB_0041aec2;
                    }
                    if (properties.sampleCounts != 1) {
                      local_288._0_8_ = local_288 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_288,
                                 "Implementation supports more sample counts than allowed by the spec"
                                 ,"");
                      tcu::ResultCollector::addResult
                                (&results,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)local_288);
                      goto LAB_0041aec2;
                    }
                  }
                  else {
                    local_288._0_8_ = local_288 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"sampleCounts != VK_SAMPLE_COUNT_1_BIT","");
                    tcu::ResultCollector::check(&results,VVar5 == 1,(string *)local_288);
LAB_0041aec2:
                    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                      operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1
                                     );
                    }
                  }
                  if (bVar31) {
                    dVar4 = properties.maxExtent.width;
                    uVar21 = (pVVar13->limits).maxImageDimension1D;
                    local_288._0_8_ = local_288 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"Reported dimensions smaller than device limits",
                               "");
                    tcu::ResultCollector::check
                              (&results,uVar21 <= dVar4 || imageType != VK_IMAGE_TYPE_1D,
                               (string *)local_288);
                    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                      operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1
                                     );
                    }
                    bVar31 = true;
                    if (imageType == VK_IMAGE_TYPE_2D) {
                      uVar21 = (pVVar13->limits).maxImageDimension2D;
                      if (properties.maxExtent.width < uVar21) {
                        bVar31 = false;
                      }
                      else {
                        bVar31 = uVar21 <= properties.maxExtent.height;
                      }
                    }
                    local_288._0_8_ = local_288 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"Reported dimensions smaller than device limits",
                               "");
                    tcu::ResultCollector::check(&results,bVar31,(string *)local_288);
                    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                      operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1
                                     );
                    }
                    bVar31 = true;
                    if (imageType == VK_IMAGE_TYPE_3D) {
                      uVar21 = (pVVar13->limits).maxImageDimension3D;
                      bVar31 = false;
                      if ((uVar21 <= properties.maxExtent.width) &&
                         (bVar31 = false, uVar21 <= properties.maxExtent.height)) {
                        bVar31 = uVar21 <= properties.maxExtent.depth;
                      }
                    }
                    local_288._0_8_ = local_288 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"Reported dimensions smaller than device limits",
                               "");
                    tcu::ResultCollector::check(&results,bVar31,(string *)local_288);
                    if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                      operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1
                                     );
                    }
                    dVar4 = properties.maxMipLevels;
                    local_288._0_8_ = local_288 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"maxMipLevels is not full mip pyramid size","");
                    tcu::ResultCollector::check(&results,dVar4 == iVar25 + 1U,(string *)local_288);
                    if ((TestLog *)local_288._0_8_ != (TestLog *)(local_288 + 0x10)) {
                      operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1
                                     );
                    }
                    dVar4 = properties.maxArrayLayers;
                    uVar21 = (pVVar13->limits).maxImageArrayLayers;
                    local_288._0_8_ = (TestLog *)(local_288 + 0x10);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"maxArrayLayers smaller than device limits","");
                    tcu::ResultCollector::check
                              (&results,uVar21 <= dVar4 || imageType == VK_IMAGE_TYPE_3D,
                               (string *)local_288);
                  }
                  else {
                    dVar4 = properties.maxMipLevels;
                    local_288._0_8_ = local_288 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"Invalid mip pyramid size","");
                    tcu::ResultCollector::check
                              (&results,dVar4 == iVar25 + 1U || dVar4 == 1,(string *)local_288);
                    if ((TestLog *)local_288._0_8_ != (TestLog *)(local_288 + 0x10)) {
                      operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1
                                     );
                    }
                    dVar4 = properties.maxArrayLayers;
                    local_288._0_8_ = (TestLog *)(local_288 + 0x10);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_288,"Invalid maxArrayLayers","");
                    tcu::ResultCollector::check(&results,dVar4 != 0,(string *)local_288);
                  }
                  if ((TestLog *)local_288._0_8_ != (TestLog *)(local_288 + 0x10)) {
                    operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
                  }
                  VVar6 = properties.maxResourceSize;
                  local_288._0_8_ = (TestLog *)(local_288 + 0x10);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_288,
                             "maxResourceSize smaller than minimum required size","");
                  tcu::ResultCollector::check(&results,0x7fffffff < VVar6,(string *)local_288);
                  goto LAB_0041b396;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
                local_68.m_value = (deUint64)::vk::getResultName;
                local_68.m_begin._0_4_ = iVar8;
                tcu::Format::Enum<vk::VkResult,_4UL>::toStream
                          ((Enum<vk::VkResult,_4UL> *)&local_68,(ostream *)local_288);
                std::__cxx11::stringbuf::str();
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
                std::ios_base::~ios_base(local_218);
                plVar19 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_98,0,(char *)0x0,0xaa607d);
                local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
                paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar19 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar19 == paVar22) {
                  local_2a8.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
                  local_2a8.field_2._8_8_ = plVar19[3];
                }
                else {
                  local_2a8.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
                  local_2a8._M_dataplus._M_p = (pointer)*plVar19;
                }
                local_2a8._M_string_length = plVar19[1];
                *plVar19 = (long)paVar22;
                plVar19[1] = 0;
                *(undefined1 *)(plVar19 + 2) = 0;
                tcu::ResultCollector::fail(&results,&local_2a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                  operator_delete(local_2a8._M_dataplus._M_p,
                                  local_2a8.field_2._M_allocated_capacity + 1);
                }
                uVar26 = local_98.m_end;
                pTVar27 = (TestLog *)local_98.m_value;
                if ((BitDesc **)local_98.m_value == &local_98.m_end) goto LAB_0041b3b7;
              }
              operator_delete(pTVar27,(ulong)((long)&((BitDesc *)uVar26)->bit + 1));
            }
LAB_0041b3b7:
            uVar24 = (ulong)(uVar23 + 1);
          } while (local_100 != uVar23 + 1);
        }
      }
      else if ((uVar28 & 0x30) != 0 && (uVar28 & 0x7fffff0f) == 0) {
        bVar32 = true;
        local_100 = 0;
        goto LAB_0041a52b;
      }
    }
    bVar32 = uVar28 == (uint)local_70;
    uVar28 = uVar28 + 1;
    if (bVar32) {
      qVar11 = tcu::ResultCollector::getResult(&results);
      local_288._0_8_ = local_288 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_288,results.m_message._M_dataplus._M_p,
                 results.m_message._M_dataplus._M_p + results.m_message._M_string_length);
      pTVar7 = local_78;
      local_78->m_code = qVar11;
      (local_78->m_description)._M_dataplus._M_p = (pointer)&(local_78->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78->m_description,local_288._0_8_,
                 (pointer)(local_288._0_8_ + local_288._8_8_));
      if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
        operator_delete((void *)local_288._0_8_,local_278[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)results.m_message._M_dataplus._M_p != &results.m_message.field_2) {
        operator_delete(results.m_message._M_dataplus._M_p,
                        results.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)results.m_prefix._M_dataplus._M_p != &results.m_prefix.field_2) {
        operator_delete(results.m_prefix._M_dataplus._M_p,
                        results.m_prefix.field_2._M_allocated_capacity + 1);
      }
      return pTVar7;
    }
  } while( true );
}

Assistant:

tcu::TestStatus imageFormatProperties (Context& context, const VkFormat format, const VkImageType imageType, const VkImageTiling tiling)
{
	TestLog&						log					= context.getTestContext().getLog();
	const VkPhysicalDeviceFeatures&	deviceFeatures		= context.getDeviceFeatures();
	const VkPhysicalDeviceLimits&	deviceLimits		= context.getDeviceProperties().limits;
	const VkFormatProperties		formatProperties	= getPhysicalDeviceFormatProperties(context.getInstanceInterface(), context.getPhysicalDevice(), format);
	const bool						hasKhrMaintenance1	= isExtensionSupported(context.getDeviceExtensions(), "VK_KHR_maintenance1");

	const VkFormatFeatureFlags		supportedFeatures	= tiling == VK_IMAGE_TILING_LINEAR ? formatProperties.linearTilingFeatures : formatProperties.optimalTilingFeatures;
	const VkImageUsageFlags			usageFlagSet		= getValidImageUsageFlags(supportedFeatures, hasKhrMaintenance1);

	tcu::ResultCollector			results				(log, "ERROR: ");

	if (hasKhrMaintenance1 && (supportedFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0)
	{
		results.check((supportedFeatures & (VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR | VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR)) != 0,
					  "A sampled image format must have VK_FORMAT_FEATURE_TRANSFER_SRC_BIT_KHR and VK_FORMAT_FEATURE_TRANSFER_DST_BIT_KHR format feature flags set");
	}

	for (VkImageUsageFlags curUsageFlags = 0; curUsageFlags <= usageFlagSet; curUsageFlags++)
	{
		if ((curUsageFlags & ~usageFlagSet) != 0 ||
			!isValidImageUsageFlagCombination(curUsageFlags))
			continue;

		const VkImageCreateFlags	createFlagSet		= getValidImageCreateFlags(deviceFeatures, format, supportedFeatures, imageType, curUsageFlags);

		for (VkImageCreateFlags curCreateFlags = 0; curCreateFlags <= createFlagSet; curCreateFlags++)
		{
			if ((curCreateFlags & ~createFlagSet) != 0 ||
				!isValidImageCreateFlagCombination(curCreateFlags))
				continue;

			const bool				isRequiredCombination	= isRequiredImageParameterCombination(deviceFeatures,
																								  format,
																								  formatProperties,
																								  imageType,
																								  tiling,
																								  curUsageFlags,
																								  curCreateFlags);
			VkImageFormatProperties	properties;
			VkResult				queryResult;

			log << TestLog::Message << "Testing " << getImageTypeStr(imageType) << ", "
									<< getImageTilingStr(tiling) << ", "
									<< getImageUsageFlagsStr(curUsageFlags) << ", "
									<< getImageCreateFlagsStr(curCreateFlags)
				<< TestLog::EndMessage;

			// Set return value to known garbage
			deMemset(&properties, 0xcd, sizeof(properties));

			queryResult = context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(context.getPhysicalDevice(),
																								format,
																								imageType,
																								tiling,
																								curUsageFlags,
																								curCreateFlags,
																								&properties);

			if (queryResult == VK_SUCCESS)
			{
				const deUint32	fullMipPyramidSize	= de::max(de::max(deLog2Ceil32(properties.maxExtent.width),
																	  deLog2Ceil32(properties.maxExtent.height)),
															  deLog2Ceil32(properties.maxExtent.depth)) + 1;

				log << TestLog::Message << properties << "\n" << TestLog::EndMessage;

				results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width >= 1 && properties.maxExtent.height == 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 1D image");
				results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth == 1), "Invalid dimensions for 2D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width >= 1 && properties.maxExtent.height >= 1 && properties.maxExtent.depth >= 1), "Invalid dimensions for 3D image");
				results.check(imageType != VK_IMAGE_TYPE_3D || properties.maxArrayLayers == 1, "Invalid maxArrayLayers for 3D image");

				if (tiling == VK_IMAGE_TILING_OPTIMAL)
				{
					// Vulkan API specification has changed since initial Android Nougat release.
					// For NYC CTS we need to tolerate old behavior as well and issue compatibility
					// warning instead.
					//
					// See spec issues 272, 282, 302, 445 and CTS issues 369, 440.
					const bool	requiredByNewSpec	= (imageType == VK_IMAGE_TYPE_2D && !(curCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) &&
													  ((supportedFeatures & (VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT | VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT)) ||
													  ((supportedFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT) && deviceFeatures.shaderStorageImageMultisample)));

					if (requiredByNewSpec)
					{
						const VkSampleCountFlags	requiredSampleCounts	= getRequiredOptimalTilingSampleCounts(deviceLimits, format, curUsageFlags);

						results.check((properties.sampleCounts & requiredSampleCounts) == requiredSampleCounts, "Required sample counts not supported");
					}
					else if (properties.sampleCounts != VK_SAMPLE_COUNT_1_BIT)
					{
						results.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING,
									      "Implementation supports more sample counts than allowed by the spec");
					}
				}
				else
					results.check(properties.sampleCounts == VK_SAMPLE_COUNT_1_BIT, "sampleCounts != VK_SAMPLE_COUNT_1_BIT");

				if (isRequiredCombination)
				{
					results.check(imageType != VK_IMAGE_TYPE_1D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension1D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_2D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension2D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension2D),
								  "Reported dimensions smaller than device limits");
					results.check(imageType != VK_IMAGE_TYPE_3D || (properties.maxExtent.width	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.height	>= deviceLimits.maxImageDimension3D &&
																	properties.maxExtent.depth	>= deviceLimits.maxImageDimension3D),
								  "Reported dimensions smaller than device limits");
					results.check(properties.maxMipLevels == fullMipPyramidSize, "maxMipLevels is not full mip pyramid size");
					results.check(imageType == VK_IMAGE_TYPE_3D || properties.maxArrayLayers >= deviceLimits.maxImageArrayLayers,
								  "maxArrayLayers smaller than device limits");
				}
				else
				{
					results.check(properties.maxMipLevels == 1 || properties.maxMipLevels == fullMipPyramidSize, "Invalid mip pyramid size");
					results.check(properties.maxArrayLayers >= 1, "Invalid maxArrayLayers");
				}

				results.check(properties.maxResourceSize >= (VkDeviceSize)MINIMUM_REQUIRED_IMAGE_RESOURCE_SIZE,
							  "maxResourceSize smaller than minimum required size");
			}
			else if (queryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
			{
				log << TestLog::Message << "Got VK_ERROR_FORMAT_NOT_SUPPORTED" << TestLog::EndMessage;

				if (isRequiredCombination)
					results.fail("VK_ERROR_FORMAT_NOT_SUPPORTED returned for required image parameter combination");

				// Specification requires that all fields are set to 0
				results.check(properties.maxExtent.width	== 0, "maxExtent.width != 0");
				results.check(properties.maxExtent.height	== 0, "maxExtent.height != 0");
				results.check(properties.maxExtent.depth	== 0, "maxExtent.depth != 0");
				results.check(properties.maxMipLevels		== 0, "maxMipLevels != 0");
				results.check(properties.maxArrayLayers		== 0, "maxArrayLayers != 0");
				results.check(properties.sampleCounts		== 0, "sampleCounts != 0");
				results.check(properties.maxResourceSize	== 0, "maxResourceSize != 0");
			}
			else
			{
				results.fail("Got unexpected error" + de::toString(queryResult));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}